

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O3

DEFBUF * defendel(Global *global,char *name,int delete)

{
  char *pcVar1;
  DEFBUF *pDVar2;
  char cVar3;
  int iVar4;
  DEFBUF *ptr;
  long lVar5;
  uintptr_t uVar6;
  char *pcVar7;
  
  lVar5 = 0;
  cVar3 = *name;
  pcVar7 = name;
  while (cVar3 != '\0') {
    lVar5 = lVar5 + cVar3;
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    cVar3 = *pcVar1;
  }
  uVar6 = lVar5 + ((long)pcVar7 - (long)name);
  pDVar2 = (DEFBUF *)(global->symtab + ((uint)uVar6 & 0x3f));
  ptr = ((DEFBUF *)(global->symtab + ((uint)uVar6 & 0x3f)))->link;
  do {
    if (ptr == (DEFBUF *)0x0) {
LAB_0010690c:
      ptr = (DEFBUF *)0x0;
LAB_0010690f:
      if (delete == 0) {
        ptr = (DEFBUF *)Malloc((long)((int)((long)pcVar7 - (long)name) + 0x20));
        if (ptr == (defbuf *)0x0) {
          cerror(global,FATAL_OUT_OF_MEMORY);
        }
        ptr->link = pDVar2->link;
        pDVar2->link = ptr;
        ptr->hash = uVar6;
        ptr->repl = (char *)0x0;
        ptr->nargs = 0;
        strcpy(ptr->name,name);
      }
      return ptr;
    }
    if (ptr->hash == uVar6) {
      iVar4 = strcmp(ptr->name,name);
      if (-1 < iVar4) {
        if (iVar4 == 0) {
          pDVar2->link = ptr->link;
          if (ptr->repl != (char *)0x0) {
            Free(ptr->repl);
          }
          Free(ptr);
          goto LAB_0010690f;
        }
        goto LAB_0010690c;
      }
    }
    pDVar2 = ptr;
    ptr = ptr->link;
  } while( true );
}

Assistant:

DEFBUF *defendel(struct Global *global,
		 char *name,
		 int delete) 		/* TRUE to delete a symbol */
{
  /*
   * Enter this name in the lookup table (delete = FALSE)
   * or delete this name (delete = TRUE).
   * Returns a pointer to the define block (delete = FALSE)
   * Returns NULL if the symbol wasn't defined (delete = TRUE).
   */

  DEFBUF *dp;
  DEFBUF **prevp;
  char *np;
  uintptr_t nhash;
  int temp;
  size_t size;
  
  for (nhash = 0, np = name; *np != EOS;)
    nhash += *np++;
  size = (np - name);
  nhash += size;
  prevp = &global->symtab[nhash % SBSIZE];
  while ((dp = *prevp) != (DEFBUF *) NULL) {
    if (dp->hash == nhash
	&& (temp = strcmp(dp->name, name)) >= 0) {
      if (temp > 0)
	dp = NULL;			/* Not found		*/
      else {
	*prevp = dp->link;		/* Found, unlink and	*/
	if (dp->repl != NULL)       	/* Free the replacement */
	  Freemem(dp->repl);         	/* if any, and then     */
	Freemem((char *) dp);          	/* Free the symbol      */
      }
      break;
    }
    prevp = &dp->link;
  }
  if (!delete) {
    dp = (DEFBUF *) Getmem(global, (int) (sizeof (DEFBUF) + size));
    dp->link = *prevp;
    *prevp = dp;
    dp->hash = nhash;
    dp->repl = NULL;
    dp->nargs = 0;
    strcpy(dp->name, name);
  }
  return(dp);
}